

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void disableCursor(_GLFWwindow *window)

{
  Window WVar1;
  uchar local_a4 [4];
  XIEventMask em;
  
  if (_glfw.x11.xi.available != 0) {
    em.mask = local_a4;
    local_a4[0] = '\0';
    local_a4[1] = '\0';
    em.deviceid = 1;
    em.mask_len = 3;
    local_a4[2] = 2;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&em,1);
  }
  _glfw.x11.disabledCursorWindow = window;
  _glfwPlatformGetCursorPos(window,&_glfw.x11.restoreCursorPosX,&_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  XGetWindowAttributes(_glfw.x11.display,(window->x11).handle,&em);
  _glfwPlatformSetCursorPos(window,(double)(int)em.mask * 0.5,(double)em.mask._4_4_ * 0.5);
  WVar1 = (window->x11).handle;
  XGrabPointer(_glfw.x11.display,WVar1,1,0x4c,1,1,WVar1,_glfw.x11.hiddenCursorHandle,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (_glfw.x11.xi.available)
    {
        XIEventMask em;
        unsigned char mask[XIMaskLen(XI_RawMotion)] = { 0 };

        em.deviceid = XIAllMasterDevices;
        em.mask_len = sizeof(mask);
        em.mask = mask;
        XISetMask(mask, XI_RawMotion);

        XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
    }

    _glfw.x11.disabledCursorWindow = window;
    _glfwPlatformGetCursorPos(window,
                              &_glfw.x11.restoreCursorPosX,
                              &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    centerCursor(window);
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 _glfw.x11.hiddenCursorHandle,
                 CurrentTime);
}